

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::load_image_props_and_scs(CVmObjTads *this,char *ptr,size_t siz)

{
  ushort prop_00;
  int iVar1;
  int iVar2;
  vm_tadsobj_hdr *this_00;
  vm_val_t *val_00;
  unsigned_long uVar3;
  void *in_RSI;
  CVmObjTads *in_RDI;
  vm_val_t val;
  vm_prop_id_t prop;
  char *p;
  ushort i;
  ushort li_cnt;
  ushort sc_cnt;
  vm_tadsobj_hdr *hdr;
  vm_val_t *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined2 uVar4;
  uint in_stack_ffffffffffffffcc;
  ushort local_26;
  
  this_00 = get_hdr(in_RDI);
  iVar1 = ::osrp2(in_RSI);
  prop_00 = (ushort)iVar1;
  iVar1 = ::osrp2((void *)((long)in_RSI + 2));
  val_00 = (vm_val_t *)((long)in_RSI + 6);
  for (local_26 = 0; local_26 < prop_00; local_26 = local_26 + 1) {
    uVar3 = ::osrp4(val_00);
    this_00->sc[local_26].id = (vm_obj_id_t)uVar3;
    this_00->sc[local_26].objp = (CVmObjTads *)0x0;
    val_00 = (vm_val_t *)&val_00->field_0x4;
  }
  for (local_26 = 0; uVar4 = (undefined2)in_stack_ffffffffffffffcc, local_26 < (ushort)iVar1;
      local_26 = local_26 + 1) {
    iVar2 = ::osrp2(val_00);
    in_stack_ffffffffffffffcc = CONCAT22((short)iVar2,uVar4);
    vmb_get_dh(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    vm_tadsobj_hdr::alloc_prop_entry(this_00,prop_00,val_00,in_stack_ffffffffffffffcc);
    val_00 = (vm_val_t *)&val_00->field_0x7;
  }
  return;
}

Assistant:

void CVmObjTads::load_image_props_and_scs(VMG_ const char *ptr, size_t siz)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* get the number of superclasses */
    ushort sc_cnt = osrp2(ptr);

    /* get the number of load image properties */
    ushort li_cnt = osrp2(ptr + 2);

    /* read the superclasses from the load image and store them */
    ushort i;
    const char *p;
    for (i = 0, p = ptr + 6 ; i < sc_cnt ; ++i, p += 4)
    {
        /* store the object ID */
        hdr->sc[i].id = (vm_obj_id_t)t3rp4u(p);

        /* 
         *   We can't store the superclass pointer yet, as the superclass
         *   object might not be loaded yet.  Store null for now; we'll fix
         *   this up in post_load_init() after all the other objects have
         *   been loaded.  
         */
        hdr->sc[i].objp = 0;
    }

    /* read the properties from the load image and store them */
    for (i = 0 ; i < li_cnt ; ++i, p += 2 + VMB_DATAHOLDER)
    {
        /* decode the property data */
        vm_prop_id_t prop = (vm_prop_id_t)osrp2(p);
        vm_val_t val;
        vmb_get_dh(p + 2, &val);

        /* store the property */
        hdr->alloc_prop_entry(prop, &val, 0);
    }
}